

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.h
# Opt level: O1

bool __thiscall Clasp::Asp::PrgNode::assignValueImpl(PrgNode *this,ValueRep v,bool noWeak)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  
  uVar4 = (uint)CONCAT71(in_register_00000031,v);
  uVar2 = (uint)(byte)(!noWeak * '\x02' + 1);
  if (uVar4 != 3) {
    uVar2 = uVar4;
  }
  bVar3 = SUB81(*this,7) >> 4 & 3;
  bVar1 = (byte)uVar2;
  if ((bVar1 != bVar3 && bVar3 != 0) && (bVar1 != 1 || bVar3 != 3)) {
    return bVar3 == 1 && bVar1 == 3;
  }
  *this = (PrgNode)((ulong)*this & 0xcfffffffffffffff | (ulong)(bVar1 & 3) << 0x3c);
  return true;
}

Assistant:

bool assignValueImpl(ValueRep v, bool noWeak) {
		if (v == value_weak_true && noWeak) { v = value_true; }
		if (value() == value_free || v == value() || (value() == value_weak_true && v == value_true)) {
			setValue(v);
			return true;
		}
		return v == value_weak_true && value() == value_true;
	}